

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O3

void lj_cconv_bf_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o)

{
  undefined1 uVar1;
  ulong in_RAX;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t tmpbool;
  undefined8 uStack_28;
  
  uVar4 = d->info;
  uStack_28 = in_RAX;
  if ((uVar4 >> 0x1b & 1) == 0) {
    lj_cconv_ct_tv(cts,(CType *)((long)&cts->tab->info +
                                (ulong)((((uVar4 >> 0x17 & 1) != 0) + 9) * 0x10)),
                   (uint8_t *)((long)&uStack_28 + 4),o,0);
  }
  else {
    lj_cconv_ct_tv(cts,cts->tab + 3,(uint8_t *)((long)&uStack_28 + 3),o,0);
    uVar1 = uStack_28._3_1_;
    uStack_28 = (ulong)CONCAT14(uVar1,(undefined4)uStack_28);
  }
  uVar3 = uVar4 >> 8 & 0x7f;
  uVar6 = uVar4 >> 0x10 & 0x7f;
  if (uVar3 + (uVar4 & 0x7f) <= uVar6 * 8) {
    uVar3 = ~(-1 << ((byte)uVar3 & 0x1f));
    bVar2 = (byte)(uVar4 & 0x7f);
    uVar5 = uVar3 << (bVar2 & 0x1f);
    uVar4 = (uVar3 & uStack_28._4_4_) << (bVar2 & 0x1f);
    if (uVar6 == 1) {
      *dp = ~(byte)uVar5 & *dp | (byte)uVar4;
    }
    else if (uVar6 == 2) {
      *(ushort *)dp = ~(ushort)uVar5 & *(ushort *)dp | (ushort)uVar4;
    }
    else if (uVar6 == 4) {
      *(uint *)dp = ~uVar5 & *(uint *)dp | uVar4;
    }
    return;
  }
  lj_err_caller(cts->L,LJ_ERR_FFI_NYIPACKBIT);
}

Assistant:

void lj_cconv_bf_tv(CTState *cts, CType *d, uint8_t *dp, TValue *o)
{
  CTInfo info = d->info;
  CTSize pos, bsz;
  uint32_t val, mask;
  lj_assertCTS(ctype_isbitfield(info), "bitfield expected");
  if ((info & CTF_BOOL)) {
    uint8_t tmpbool;
    lj_assertCTS(ctype_bitbsz(info) == 1, "bad bool bitfield size");
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_BOOL), &tmpbool, o, 0);
    val = tmpbool;
  } else {
    CTypeID did = (info & CTF_UNSIGNED) ? CTID_UINT32 : CTID_INT32;
    lj_cconv_ct_tv(cts, ctype_get(cts, did), (uint8_t *)&val, o, 0);
  }
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lj_assertCTS(pos < 8*ctype_bitcsz(info), "bad bitfield position");
  lj_assertCTS(bsz > 0 && bsz <= 8*ctype_bitcsz(info), "bad bitfield size");
  /* Check if a packed bitfield crosses a container boundary. */
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  mask = ((1u << bsz) - 1u) << pos;
  val = (val << pos) & mask;
  /* NYI: packed bitfields may cause misaligned reads/writes. */
  switch (ctype_bitcsz(info)) {
  case 4: *(uint32_t *)dp = (*(uint32_t *)dp & ~mask) | (uint32_t)val; break;
  case 2: *(uint16_t *)dp = (*(uint16_t *)dp & ~mask) | (uint16_t)val; break;
  case 1: *(uint8_t *)dp = (*(uint8_t *)dp & ~mask) | (uint8_t)val; break;
  default:
    lj_assertCTS(0, "bad bitfield container size %d", ctype_bitcsz(info));
    break;
  }
}